

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::SourceCodeInfo_Location::SerializeWithCachedSizes
          (SourceCodeInfo_Location *this,CodedOutputStream *output)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  int32 iVar2;
  uint uVar3;
  int i;
  int iVar4;
  
  if (0 < (this->path_).current_size_) {
    io::CodedOutputStream::WriteVarint32(output,10);
    io::CodedOutputStream::WriteVarint32(output,this->_path_cached_byte_size_);
  }
  for (iVar4 = 0; iVar4 < (this->path_).current_size_; iVar4 = iVar4 + 1) {
    iVar2 = path(this,iVar4);
    io::CodedOutputStream::WriteVarint32SignExtended(output,iVar2);
  }
  if (0 < (this->span_).current_size_) {
    io::CodedOutputStream::WriteVarint32(output,0x12);
    io::CodedOutputStream::WriteVarint32(output,this->_span_cached_byte_size_);
  }
  for (iVar4 = 0; iVar4 < (this->span_).current_size_; iVar4 = iVar4 + 1) {
    iVar2 = span(this,iVar4);
    io::CodedOutputStream::WriteVarint32SignExtended(output,iVar2);
  }
  uVar3 = this->_has_bits_[0];
  if ((uVar3 & 4) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->leading_comments_->_M_dataplus)._M_p,
               (int)this->leading_comments_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(3,this->leading_comments_,output);
    uVar3 = this->_has_bits_[0];
  }
  if ((uVar3 & 8) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->trailing_comments_->_M_dataplus)._M_p,
               (int)this->trailing_comments_->_M_string_length,SERIALIZE);
    internal::WireFormatLite::WriteString(4,this->trailing_comments_,output);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    internal::WireFormat::SerializeUnknownFields(&this->_unknown_fields_,output);
    return;
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // repeated int32 path = 1 [packed = true];
  if (this->path_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_path_cached_byte_size_);
  }
  for (int i = 0; i < this->path_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->path(i), output);
  }

  // repeated int32 span = 2 [packed = true];
  if (this->span_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_span_cached_byte_size_);
  }
  for (int i = 0; i < this->span_size(); i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32NoTag(
      this->span(i), output);
  }

  // optional string leading_comments = 3;
  if (has_leading_comments()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->leading_comments().data(), this->leading_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      3, this->leading_comments(), output);
  }

  // optional string trailing_comments = 4;
  if (has_trailing_comments()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->trailing_comments().data(), this->trailing_comments().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    ::google::protobuf::internal::WireFormatLite::WriteString(
      4, this->trailing_comments(), output);
  }

  if (!unknown_fields().empty()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
}